

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

bool __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::insert(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
         *this,value_type *value)

{
  int iVar1;
  node *pnVar2;
  bool bVar3;
  int iVar4;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_01;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  locType extraout_RDX;
  locType extraout_RDX_00;
  long lVar11;
  long lVar12;
  long lVar13;
  locType *plVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  node **ppnVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  pair<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node_*,_long>
  lnk;
  pair<unsigned_long_long,_int> tmpk [100];
  long tmpv [100];
  locType local_9a8;
  undefined8 uStack_9a0;
  undefined8 uStack_998;
  ulong auStack_990 [2];
  undefined4 auStack_980 [394];
  long local_358;
  undefined1 local_350 [800];
  node *pnVar5;
  undefined4 extraout_var_00;
  
  uVar7 = (value->first).first;
  iVar1 = (value->first).second;
  lVar11 = value->second;
  iVar4 = this->depth;
  lVar12 = (long)iVar4;
  if (lVar12 == 0) {
    iVar4 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar6 = (long *)CONCAT44(extraout_var_00,iVar4);
    this->root = extraout_RDX;
    this->depth = 1;
    *(undefined4 *)(plVar6 + 299) = 1;
    plVar6[0x65] = uVar7;
    *(int *)(plVar6 + 0x66) = iVar1;
    *plVar6 = lVar11;
    plVar6[100] = -1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
    return true;
  }
  uVar21 = lVar12 * 8;
  if (iVar4 < 0) {
    uVar21 = 0xffffffffffffffff;
  }
  uVar17 = lVar12 * 4;
  if (iVar4 < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pos = (locType *)operator_new__(uVar21);
  *pos = 0;
  p = (node **)operator_new__(uVar21);
  pp = (int *)operator_new__(uVar17);
  *pos = this->root;
  if (iVar4 < 1) {
    ppnVar18 = p + lVar12 + -1;
LAB_00112421:
    pnVar5 = *ppnVar18;
    iVar9 = pnVar5->sz;
    uVar20 = 0;
  }
  else {
    lVar12 = 0;
    do {
      iVar4 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                )._vptr_FileManager_Base[2])(this->file,pos + lVar12);
      pnVar5 = (node *)CONCAT44(extraout_var,iVar4);
      p[lVar12] = pnVar5;
      uVar20 = pnVar5->sz;
      uVar21 = 0;
      if (0 < (long)(int)uVar20) {
        piVar10 = &pnVar5->keyvalue[0].second;
        uVar21 = 0;
        do {
          if ((uVar7 <= ((pair<unsigned_long_long,_int> *)(piVar10 + -2))->first) &&
             ((uVar7 < ((pair<unsigned_long_long,_int> *)(piVar10 + -2))->first ||
              (iVar1 <= *piVar10)))) {
            iVar4 = this->depth;
            if ((long)iVar4 + -1 <= lVar12) goto LAB_001122ef;
            if (((pair<unsigned_long_long,_int> *)(piVar10 + -2))->first <= uVar7) {
              if (((pair<unsigned_long_long,_int> *)(piVar10 + -2))->first < uVar7) {
                uVar21 = (ulong)((int)uVar21 + 1);
              }
              else if (*piVar10 <= iVar1) {
                uVar21 = uVar21 + 1;
              }
            }
            goto LAB_001122c4;
          }
          uVar21 = uVar21 + 1;
          piVar10 = piVar10 + 4;
        } while ((long)(int)uVar20 != uVar21);
        uVar21 = (ulong)uVar20;
      }
      iVar4 = this->depth;
      if (lVar12 < (long)iVar4 + -1) {
LAB_001122c4:
        (pos + lVar12)[1] = (pnVar5->field_0).val[(int)uVar21];
      }
LAB_001122ef:
      uVar20 = (uint)uVar21;
      pp[lVar12] = uVar20;
      lVar12 = lVar12 + 1;
      lVar13 = (long)iVar4;
    } while (lVar12 < lVar13);
    pnVar5 = p[lVar13 + -1];
    iVar9 = pnVar5->sz;
    if ((int)uVar20 < iVar9) {
      uVar21 = pnVar5->keyvalue[(int)uVar20].first;
      if ((uVar21 <= uVar7) && ((uVar21 < uVar7 || (pnVar5->keyvalue[(int)uVar20].second <= iVar1)))
         ) {
        operator_delete__(p);
        operator_delete__(pp);
        operator_delete__(pos);
        return false;
      }
    }
    ppnVar18 = p + lVar13 + -1;
    if ((uVar20 == 0) && (uVar20 = 0, 1 < iVar4)) {
      plVar14 = pos + (iVar4 - 2);
      lVar12 = (ulong)(iVar4 - 2) + 1;
      do {
        lVar13 = (long)pp[lVar12 + -1];
        if (lVar13 != 0) {
          uVar21 = pnVar5->keyvalue[0].first;
          pnVar2 = p[lVar12 + -1];
          uVar17 = pnVar2->keyvalue[lVar13 + -1].first;
          if (((uVar17 <= uVar21) && (uVar21 <= uVar17)) &&
             (pnVar2->keyvalue[lVar13 + -1].second == pnVar5->keyvalue[0].second)) {
            pnVar2->keyvalue[lVar13 + -1].first = uVar7;
            pnVar2->keyvalue[lVar13 + -1].second = iVar1;
            (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
              )._vptr_FileManager_Base[3])(this->file,plVar14);
            goto LAB_00112421;
          }
        }
        plVar14 = plVar14 + -1;
        lVar13 = lVar12 + -1;
        bVar3 = 0 < lVar12;
        lVar12 = lVar13;
      } while (lVar13 != 0 && bVar3);
    }
  }
  if (iVar9 < 99) {
    if ((int)uVar20 < iVar9) {
      lVar12 = (long)iVar9;
      lVar13 = lVar12 * 0x10 + 0x330;
      do {
        pnVar5 = *ppnVar18;
        *(undefined8 *)((long)pnVar5 + lVar13 + -8) = *(undefined8 *)((long)pnVar5 + lVar13 + -0x18)
        ;
        *(undefined4 *)((long)&pnVar5->field_0 + lVar13) =
             *(undefined4 *)((long)pnVar5 + lVar13 + -0x10);
        (pnVar5->field_0).val[lVar12] = *(long *)((long)pnVar5 + lVar12 * 8 + -8);
        lVar12 = lVar12 + -1;
        lVar13 = lVar13 + -0x10;
      } while ((int)uVar20 < lVar12);
      pnVar5 = *ppnVar18;
    }
    pnVar5->keyvalue[(int)uVar20].first = uVar7;
    pnVar5->keyvalue[(int)uVar20].second = iVar1;
    (pnVar5->field_0).val[(int)uVar20] = lVar11;
    (*ppnVar18)->sz = (*ppnVar18)->sz + 1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    goto LAB_00112776;
  }
  lVar12 = 8;
  do {
    *(undefined8 *)((long)&uStack_9a0 + lVar12) = 0;
    *(undefined4 *)((long)auStack_990 + lVar12 + -8) = 0;
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x648);
  iVar4 = (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
            )._vptr_FileManager_Base[1])();
  lVar12 = CONCAT44(extraout_var_01,iVar4);
  pnVar5 = *ppnVar18;
  local_9a8 = extraout_RDX_00;
  if ((int)uVar20 < 1) {
    uVar21 = (ulong)(int)uVar20;
    *(long *)(local_350 + uVar21 * 8 + -8) = lVar11;
    auStack_990[uVar21 * 2 + -1] = uVar7;
    *(int *)(auStack_990 + uVar21 * 2) = iVar1;
LAB_001125b3:
    memcpy(local_350 + uVar21 * 8,(void *)((long)&pnVar5->field_0 + uVar21 * 8),
           (ulong)(0x62 - uVar20) * 8 + 8);
    lVar11 = uVar21 << 4;
    do {
      *(undefined8 *)((long)auStack_990 + lVar11 + 8) =
           *(undefined8 *)((long)&pnVar5->keyvalue[0].first + lVar11);
      *(undefined4 *)((long)auStack_980 + lVar11) =
           *(undefined4 *)((long)&pnVar5->keyvalue[0].second + lVar11);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x630);
  }
  else {
    uVar21 = (ulong)uVar20;
    memcpy(&local_358,pnVar5,uVar21 * 8);
    lVar13 = 0;
    do {
      *(undefined8 *)((long)auStack_990 + lVar13 + -8) =
           *(undefined8 *)((long)&pnVar5->keyvalue[0].first + lVar13);
      *(undefined4 *)((long)auStack_990 + lVar13) =
           *(undefined4 *)((long)&pnVar5->keyvalue[0].second + lVar13);
      lVar13 = lVar13 + 0x10;
    } while (uVar21 << 4 != lVar13);
    *(long *)(local_350 + uVar21 * 8 + -8) = lVar11;
    auStack_990[uVar21 * 2 + -1] = uVar7;
    *(int *)(auStack_990 + uVar21 * 2) = iVar1;
    if ((int)uVar20 < 99) goto LAB_001125b3;
  }
  *(locType *)(lVar12 + 800) = pnVar5->nxt;
  pnVar5->sz = 0x32;
  lVar11 = 0;
  lVar13 = 0;
  do {
    (pnVar5->field_0).val[lVar13] = *(long *)(local_350 + lVar13 * 8 + -8);
    pnVar5 = *ppnVar18;
    *(undefined8 *)((long)&pnVar5->keyvalue[0].first + lVar11) =
         *(undefined8 *)((long)auStack_990 + lVar11 + -8);
    *(undefined4 *)((long)&pnVar5->keyvalue[0].second + lVar11) =
         *(undefined4 *)((long)auStack_990 + lVar11);
    lVar13 = lVar13 + 1;
    uVar20 = pnVar5->sz;
    uVar7 = (ulong)uVar20;
    lVar8 = (long)(int)uVar20;
    lVar11 = lVar11 + 0x10;
  } while (lVar13 < lVar8);
  pnVar5->nxt = extraout_RDX_00;
  if ((int)uVar20 < 100) {
    lVar15 = lVar8 * 0x10;
    lVar11 = lVar8 * 8;
    lVar13 = lVar8 * 8;
    lVar16 = 0;
    do {
      lVar8 = lVar8 + 1;
      *(undefined8 *)(lVar12 + lVar11 + (long)(int)uVar7 * -8 + lVar16) =
           *(undefined8 *)(local_350 + lVar16 + lVar13 + -8);
      uVar20 = (*ppnVar18)->sz;
      uVar7 = (ulong)(int)uVar20;
      lVar19 = lVar12 + lVar15 + uVar7 * -0x10;
      *(undefined8 *)(lVar19 + 0x328 + lVar16 * 2) =
           *(undefined8 *)((long)auStack_990 + lVar16 * 2 + lVar15 + -8);
      *(undefined4 *)(lVar19 + 0x330 + lVar16 * 2) =
           *(undefined4 *)((long)auStack_990 + lVar16 * 2 + lVar15);
      lVar16 = lVar16 + 8;
    } while ((int)lVar8 != 100);
  }
  *(uint *)(lVar12 + 0x958) = 100 - uVar20;
  (*(this->file->
    super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
    )._vptr_FileManager_Base[3])(this->file,&local_9a8);
  (*(this->file->
    super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
    )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
  uStack_9a0._4_4_ = this->depth + -2;
  insertnonleaf(this,(pair<unsigned_long_long,_int> *)(lVar12 + 0x328),
                (int *)((long)&uStack_9a0 + 4),p,pp,pos,local_9a8);
LAB_00112776:
  operator_delete__(p);
  operator_delete__(pp);
  operator_delete__(pos);
  this->siz = this->siz + 1;
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }